

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O3

void genDotSurface(atom *allMainAtoms,atomBins *abins,atom *allMovingAtoms,atomBins *bbins,
                  pointSet *dots,float probeRad,float spikelen,int srcFlag,dotNode *(*results) [7])

{
  atomBins *abins_00;
  int iVar1;
  atom *paVar2;
  int local_44;
  pointSet *local_40;
  atomBins *local_38;
  
  local_40 = dots;
  local_38 = bbins;
  if (allMainAtoms != (atom *)0x0) {
    do {
      if ((allMainAtoms->flags & srcFlag) != 0) {
        paVar2 = findTouchingAtoms(allMainAtoms,(atom *)0x0,abins,probeRad,0,&local_44);
        if (bbins != (atomBins *)0x0 && allMovingAtoms != (atom *)0x0) {
          paVar2 = findTouchingAtoms(allMainAtoms,paVar2,local_38,probeRad,0,&local_44);
        }
        if (paVar2 == (atom *)0x0) {
          iVar1 = allMainAtoms->atomclass;
          if (iVar1 < 0) {
            iVar1 = allMainAtoms->elem;
            getAtno(iVar1);
            allMainAtoms->atomclass = iVar1;
          }
          paVar2 = (atom *)0x0;
        }
        else {
          markBonds(allMainAtoms,paVar2,1,1);
          iVar1 = dotType(allMainAtoms,paVar2,0);
        }
        surfDots(allMainAtoms,iVar1,paVar2,local_40,probeRad,spikelen,results);
        if ((Verbose == '\0') && ((ShowTicks & 1) == 0)) {
          genDotSurface_cold_1();
        }
      }
      allMainAtoms = allMainAtoms->next;
    } while (allMainAtoms != (atom_t *)0x0);
  }
  abins_00 = local_38;
  if (bbins != (atomBins *)0x0 && allMovingAtoms != (atom *)0x0) {
    do {
      if ((allMovingAtoms->flags & srcFlag) != 0) {
        paVar2 = findTouchingAtoms(allMovingAtoms,(atom *)0x0,abins,probeRad,0,&local_44);
        paVar2 = findTouchingAtoms(allMovingAtoms,paVar2,abins_00,probeRad,0,&local_44);
        if (paVar2 == (atom *)0x0) {
          iVar1 = allMovingAtoms->atomclass;
          if (iVar1 < 0) {
            iVar1 = allMovingAtoms->elem;
            getAtno(iVar1);
            allMovingAtoms->atomclass = iVar1;
          }
          paVar2 = (atom *)0x0;
        }
        else {
          markBonds(allMovingAtoms,paVar2,1,1);
          iVar1 = dotType(allMovingAtoms,paVar2,0);
        }
        surfDots(allMovingAtoms,iVar1,paVar2,local_40,probeRad,spikelen,results);
        if ((Verbose == '\0') && ((ShowTicks & 1) == 0)) {
          genDotSurface_cold_2();
        }
      }
      allMovingAtoms = allMovingAtoms->next;
    } while (allMovingAtoms != (atom_t *)0x0);
  }
  return;
}

Assistant:

void genDotSurface(atom *allMainAtoms, atomBins *abins,
			atom *allMovingAtoms, atomBins *bbins,
			pointSet dots[],
			float probeRad, float spikelen, int srcFlag,
			dotNode *results[][NODEWIDTH])
{
   atom *src = NULL, *atomList = NULL, *atomList2 = NULL;
   int type = 0, usesMovingAtoms = FALSE;
   int dummy = TRUE;

   usesMovingAtoms = ((allMovingAtoms != NULL) && (bbins != NULL));

   for(src = allMainAtoms; src; src = src->next) {
      if (src->flags & srcFlag) {

	 atomList  = findTouchingAtoms(src, NULL,     abins, probeRad, 0, &dummy);
	 if (usesMovingAtoms) {
	    atomList2 = findTouchingAtoms(src, atomList, bbins, probeRad, 0, &dummy);
	 }
	 else { atomList2 = atomList; }

	 if (atomList2) {
	    markBonds(src, atomList2, 1, 1); /*in genDotSurface()*/
	 }

	 type = dotType(src, atomList2, FALSE);

	 surfDots(src, type, atomList2, dots,
		     probeRad, spikelen, results);

	 if(Verbose && ShowTicks) {
	    fprintf(stderr, "%s%d   \r",
			src->r->resname, src->r->resid);
	 }
      }
   }

   if (usesMovingAtoms) {
      for(src = allMovingAtoms; src; src = src->next) {
	 if (src->flags & srcFlag) {

	    atomList  = findTouchingAtoms(src, NULL,     abins, probeRad, 0, &dummy);
	    atomList2 = findTouchingAtoms(src, atomList, bbins, probeRad, 0, &dummy);
	    if (atomList2) {
	       markBonds(src, atomList2, 1, 1); /*in genDotSurface()*/
	    }

	    type = dotType(src, atomList2, FALSE);

	    surfDots(src, type, atomList2, dots,
		     probeRad, spikelen, results);

	    if(Verbose && ShowTicks) {
	       fprintf(stderr, "%s%d   \r",
			src->r->resname, src->r->resid);
	    }
	 }
      }
   }
}